

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_reader_iterator.cpp
# Opt level: O0

iterator * __thiscall
csv::CSVReader::iterator::operator++(iterator *__return_storage_ptr__,iterator *this,int param_1)

{
  bool bVar1;
  int param_1_local;
  iterator *this_local;
  iterator *temp;
  
  iterator(__return_storage_ptr__,this);
  bVar1 = read_row(this->daddy,&this->row);
  if (!bVar1) {
    this->daddy = (CSVReader *)0x0;
  }
  return __return_storage_ptr__;
}

Assistant:

CSV_INLINE CSVReader::iterator CSVReader::iterator::operator++(int) {
        auto temp = *this;
        if (!daddy->read_row(this->row)) {
            this->daddy = nullptr; // this == end()
        }

        return temp;
    }